

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_tag.c
# Opt level: O0

void PickleTag_transfer(PickleTag *to_tag,wchar_t *ast_node_id,wchar_t *name)

{
  wchar_t *pwVar1;
  wchar_t *name_local;
  wchar_t *ast_node_id_local;
  PickleTag *to_tag_local;
  
  (to_tag->ast_node_id).id = (wchar_t *)0x0;
  if (ast_node_id != (wchar_t *)0x0) {
    pwVar1 = StringUtilities_copy_string(ast_node_id);
    (to_tag->ast_node_id).id = pwVar1;
  }
  to_tag->name = (wchar_t *)0x0;
  if (name != (wchar_t *)0x0) {
    pwVar1 = StringUtilities_copy_string(name);
    to_tag->name = pwVar1;
  }
  return;
}

Assistant:

void PickleTag_transfer(PickleTag* to_tag, const wchar_t* ast_node_id, const wchar_t* name) {
    to_tag->ast_node_id.id = 0;
    if (ast_node_id) {
        to_tag->ast_node_id.id = StringUtilities_copy_string(ast_node_id);
    }
    to_tag->name = 0;
    if (name) {
        to_tag->name = StringUtilities_copy_string(name);
    }
}